

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_creation.cpp
# Opt level: O2

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::createGarbageGridMesh
          (SceneGraph *this,int hash,size_t numGrids,bool mblur,
          Ref<embree::SceneGraph::MaterialNode> *material)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  pointer pGVar3;
  pointer pvVar4;
  Vec3fa *pVVar5;
  undefined8 uVar6;
  uint uVar7;
  GridMeshNode *this_00;
  long lVar8;
  Vec3fa *pVVar9;
  uint uVar10;
  undefined7 in_register_00000009;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  size_t sVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  bool bVar21;
  Ref<embree::SceneGraph::MaterialNode> local_48;
  undefined4 local_3c;
  Node *local_38;
  
  local_38 = (Node *)this;
  this_00 = (GridMeshNode *)::operator_new(0xa8);
  local_48 = (Ref<embree::SceneGraph::MaterialNode>)material->ptr;
  if (local_48.ptr != (MaterialNode *)0x0) {
    (*((local_48.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
  }
  local_3c = (undefined4)CONCAT71(in_register_00000009,mblur);
  GridMeshNode::GridMeshNode(this_00,&local_48,(BBox1f)0x3f80000000000000,(ulong)mblur + 1);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  if (local_48.ptr != (MaterialNode *)0x0) {
    (*((local_48.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  std::
  vector<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
  ::resize(&this_00->grids,numGrids);
  uVar7 = (uint)(hash * -0x3361d2af) >> 0x11 | hash * 0x16a88000;
  uVar7 = (uVar7 * -0x194da000 | uVar7 * 0x1b873593 >> 0x13) * 5 + 0xe6546b64;
  uVar7 = (uVar7 >> 0x10 ^ uVar7) * -0x7a143595;
  uVar7 = (uVar7 >> 0xd ^ uVar7) * -0x3d4d51cb;
  uVar7 = uVar7 >> 0x10 ^ uVar7;
  lVar8 = 10;
  uVar10 = 0;
  sVar15 = numGrids;
  while (bVar21 = sVar15 != 0, sVar15 = sVar15 - 1, bVar21) {
    uVar18 = uVar7 * 0x19660d + 0x3c6ef35f;
    uVar16 = uVar7 * 0x17385ca9 + 0x47502932;
    uVar7 = uVar16;
    if ((uVar18 & 0x3e) != 0) {
      uVar16 = uVar10;
      uVar7 = uVar18;
    }
    pGVar3 = (this_00->grids).
             super__Vector_base<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(uint *)((long)pGVar3 + lVar8 + -10) = uVar16;
    *(undefined8 *)((long)pGVar3 + lVar8 + -6) = 0x2000200000002;
    lVar8 = lVar8 + 0xc;
    uVar10 = uVar10 + 4;
  }
  pvVar4 = (this_00->positions).
           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar13 = numGrids << 2;
  uVar11 = pvVar4->size_alloced;
  uVar20 = uVar11;
  if ((uVar11 < uVar13) && (uVar19 = uVar11, uVar20 = uVar13, uVar11 != 0)) {
    for (; uVar20 = uVar19, uVar19 < uVar13; uVar19 = uVar19 * 2 + (ulong)(uVar19 * 2 == 0)) {
    }
  }
  if (uVar13 < pvVar4->size_active) {
    pvVar4->size_active = uVar13;
  }
  if (uVar11 == uVar20) {
    pvVar4->size_active = uVar13;
  }
  else {
    pVVar5 = pvVar4->items;
    pVVar9 = (Vec3fa *)alignedMalloc(uVar20 << 4,0x10);
    pvVar4->items = pVVar9;
    lVar8 = 0;
    for (uVar11 = 0; uVar11 < pvVar4->size_active; uVar11 = uVar11 + 1) {
      puVar1 = (undefined8 *)((long)&pVVar5->field_0 + lVar8);
      uVar6 = puVar1[1];
      puVar2 = (undefined8 *)((long)&pvVar4->items->field_0 + lVar8);
      *puVar2 = *puVar1;
      puVar2[1] = uVar6;
      lVar8 = lVar8 + 0x10;
    }
    alignedFree(pVVar5);
    pvVar4->size_active = uVar13;
    pvVar4->size_alloced = uVar20;
  }
  lVar8 = 0;
  uVar11 = uVar13;
  while (bVar21 = uVar11 != 0, uVar11 = uVar11 - 1, bVar21) {
    iVar12 = uVar7 * 0x19660d;
    iVar14 = uVar7 * 0x17385ca9;
    iVar17 = uVar7 * -0x50b6f56b;
    uVar7 = uVar7 * 0x979e791 + 0xaaf95334;
    puVar1 = (undefined8 *)
             ((long)&((this_00->positions).
                      super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->items->field_0 + lVar8);
    *puVar1 = CONCAT44(iVar14 + 0x47502932,iVar12 + 0x3c6ef35f);
    puVar1[1] = CONCAT44(uVar7,iVar17 + -0x2e330917);
    lVar8 = lVar8 + 0x10;
  }
  if ((char)local_3c != '\0') {
    pvVar4 = (this_00->positions).
             super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar11 = pvVar4[1].size_alloced;
    uVar20 = uVar11;
    if ((uVar11 < uVar13) && (uVar19 = uVar11, uVar20 = uVar13, uVar11 != 0)) {
      for (; uVar20 = uVar19, uVar19 < uVar13; uVar19 = uVar19 * 2 + (ulong)(uVar19 * 2 == 0)) {
      }
    }
    if (uVar13 < pvVar4[1].size_active) {
      pvVar4[1].size_active = uVar13;
    }
    if (uVar11 == uVar20) {
      pvVar4[1].size_active = uVar13;
    }
    else {
      pVVar5 = pvVar4[1].items;
      pVVar9 = (Vec3fa *)alignedMalloc(uVar20 << 4,0x10);
      pvVar4[1].items = pVVar9;
      lVar8 = 0;
      for (uVar11 = 0; uVar11 < pvVar4[1].size_active; uVar11 = uVar11 + 1) {
        puVar1 = (undefined8 *)((long)&pVVar5->field_0 + lVar8);
        uVar6 = puVar1[1];
        puVar2 = (undefined8 *)((long)&(pvVar4[1].items)->field_0 + lVar8);
        *puVar2 = *puVar1;
        puVar2[1] = uVar6;
        lVar8 = lVar8 + 0x10;
      }
      alignedFree(pVVar5);
      pvVar4[1].size_active = uVar13;
      pvVar4[1].size_alloced = uVar20;
    }
    lVar8 = 0;
    while (bVar21 = uVar13 != 0, uVar13 = uVar13 - 1, bVar21) {
      iVar12 = uVar7 * 0x19660d;
      iVar14 = uVar7 * 0x17385ca9;
      iVar17 = uVar7 * -0x50b6f56b;
      uVar7 = uVar7 * 0x979e791 + 0xaaf95334;
      puVar1 = (undefined8 *)
               ((long)&((this_00->positions).
                        super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1].items)->field_0 + lVar8);
      *puVar1 = CONCAT44(iVar14 + 0x47502932,iVar12 + 0x3c6ef35f);
      puVar1[1] = CONCAT44(uVar7,iVar17 + -0x2e330917);
      lVar8 = lVar8 + 0x10;
    }
  }
  (local_38->super_RefCount)._vptr_RefCount = (_func_int **)this_00;
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[3])(this_00);
  return (Ref<embree::SceneGraph::Node>)local_38;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::createGarbageGridMesh (int hash, size_t numGrids, bool mblur, Ref<MaterialNode> material)
  {
    RandomSampler sampler;
    RandomSampler_init(sampler,hash);
    Ref<SceneGraph::GridMeshNode> mesh = new SceneGraph::GridMeshNode(material,BBox1f(0,1),mblur?2:1);

    mesh->grids.resize(numGrids);
    for (size_t i=0; i<numGrids; i++) {
      const unsigned v0 = (RandomSampler_getInt(sampler) % 32 == 0) ? RandomSampler_getUInt(sampler) : unsigned(4*i+0);
      mesh->grids[i] = GridMeshNode::Grid(v0,2,2,2);
    }

    mesh->positions[0].resize(4*numGrids);
    for (size_t i=0; i<4*numGrids; i++) {
      const float x = cast_i2f(RandomSampler_getUInt(sampler));
      const float y = cast_i2f(RandomSampler_getUInt(sampler));
      const float z = cast_i2f(RandomSampler_getUInt(sampler));
      const float w = cast_i2f(RandomSampler_getUInt(sampler));
      mesh->positions[0][i] = Vec3fa(Vec3ff(x,y,z,w));
    }

    if (mblur) 
    {
      mesh->positions[1].resize(4*numGrids);
      for (size_t i=0; i<4*numGrids; i++) {
        const float x = cast_i2f(RandomSampler_getUInt(sampler));
        const float y = cast_i2f(RandomSampler_getUInt(sampler));
        const float z = cast_i2f(RandomSampler_getUInt(sampler));
        const float w = cast_i2f(RandomSampler_getUInt(sampler));
        mesh->positions[1][i] = Vec3fa(Vec3ff(x,y,z,w));
      }
    }

    return mesh.dynamicCast<SceneGraph::Node>();
  }